

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int32_t zng_inflateEnd(zng_stream *strm)

{
  static_tree_desc *psVar1;
  int iVar2;
  int32_t iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    psVar1 = strm->state[1].bl_desc.stat_desc;
    iVar3 = 0;
    if (psVar1 != (static_tree_desc *)0x0) {
      (*(code *)psVar1->extra_bits)(strm->opaque,psVar1->static_tree);
      strm->state = (internal_state *)0x0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateEnd)(PREFIX3(stream) *strm) {
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;

    /* Free allocated buffers */
    free_inflate(strm);

    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}